

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O1

void __thiscall axl::io::ShmtBase::closeImpl(ShmtBase *this)

{
  int __fd;
  sem_t *psVar1;
  
  __fd = (this->m_file).m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
         m_h;
  if (__fd != -1) {
    ::close(__fd);
    (this->m_file).m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
         -1;
  }
  psVar1 = (sem_t *)(this->m_readSemaphore).m_sem.
                    super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>.m_h
  ;
  if (psVar1 != (sem_t *)0x0) {
    sem_close(psVar1);
    (this->m_readSemaphore).m_sem.
    super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>.m_h = (sem_t *)0x0;
  }
  psVar1 = (sem_t *)(this->m_writeSemaphore).m_sem.
                    super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>.m_h
  ;
  if (psVar1 != (sem_t *)0x0) {
    sem_close(psVar1);
    (this->m_writeSemaphore).m_sem.
    super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>.m_h = (sem_t *)0x0;
  }
  this->m_hdr = (ShmtFileHdr *)0x0;
  this->m_data = (char *)0x0;
  return;
}

Assistant:

void
ShmtBase::closeImpl() {
	m_file.close();
	m_readSemaphore.close();
	m_writeSemaphore.close();
	m_hdr = NULL;
	m_data = NULL;
}